

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

timeval * event_base_init_common_timeout(event_base *base,timeval *duration)

{
  int iVar1;
  common_timeout_list **ppcVar2;
  common_timeout_list *pcVar3;
  int local_5c;
  common_timeout_list **newqueues;
  int n;
  common_timeout_list *ctl;
  common_timeout_list *new_ctl;
  timeval *result;
  timeval tv;
  timeval *ptStack_18;
  int i;
  timeval *duration_local;
  event_base *base_local;
  
  new_ctl = (common_timeout_list *)0x0;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  ptStack_18 = duration;
  if (1000000 < duration->tv_usec) {
    result = (timeval *)duration->tv_sec;
    tv.tv_sec = duration->tv_usec;
    iVar1 = is_common_timeout(duration,base);
    if (iVar1 != 0) {
      tv.tv_sec = tv.tv_sec & 0xfffff;
    }
    result = (timeval *)((long)&result->tv_sec + tv.tv_sec / 1000000);
    tv.tv_sec = tv.tv_sec % 1000000;
    ptStack_18 = (timeval *)&result;
  }
  for (tv.tv_usec._4_4_ = 0; tv.tv_usec._4_4_ < base->n_common_timeouts;
      tv.tv_usec._4_4_ = tv.tv_usec._4_4_ + 1) {
    pcVar3 = base->common_timeout_queues[tv.tv_usec._4_4_];
    if (((timeval *)ptStack_18->tv_sec == (timeval *)(pcVar3->duration).tv_sec) &&
       (ptStack_18->tv_usec == ((pcVar3->duration).tv_usec & 0xfffffU))) {
      iVar1 = is_common_timeout(&pcVar3->duration,base);
      if (iVar1 == 0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x5ec,"is_common_timeout(&ctl->duration, base)","event_base_init_common_timeout"
                  );
      }
      new_ctl = (common_timeout_list *)&pcVar3->duration;
      goto LAB_00388eaf;
    }
  }
  if (base->n_common_timeouts == 0x100) {
    event_warnx("%s: Too many common timeouts already in use; we only support %d per event_base",
                "event_base_init_common_timeout",0x100);
  }
  else {
    if (base->n_common_timeouts_allocated == base->n_common_timeouts) {
      if (base->n_common_timeouts < 0x10) {
        local_5c = 0x10;
      }
      else {
        local_5c = base->n_common_timeouts << 1;
      }
      ppcVar2 = (common_timeout_list **)
                event_mm_realloc_(base->common_timeout_queues,(long)local_5c << 3);
      if (ppcVar2 == (common_timeout_list **)0x0) {
        event_warn("%s: realloc","event_base_init_common_timeout");
        goto LAB_00388eaf;
      }
      base->n_common_timeouts_allocated = local_5c;
      base->common_timeout_queues = ppcVar2;
    }
    pcVar3 = (common_timeout_list *)event_mm_calloc_(1,0xa8);
    if (pcVar3 == (common_timeout_list *)0x0) {
      event_warn("%s: calloc","event_base_init_common_timeout");
    }
    else {
      (pcVar3->events).tqh_first = (event *)0x0;
      (pcVar3->events).tqh_last = (event **)pcVar3;
      (pcVar3->duration).tv_sec = (__time_t)ptStack_18->tv_sec;
      (pcVar3->duration).tv_usec =
           ptStack_18->tv_usec | 0x50000000U | (long)(base->n_common_timeouts << 0x14);
      event_assign(&pcVar3->timeout_event,base,-1,0,common_timeout_callback,pcVar3);
      (pcVar3->timeout_event).ev_evcallback.evcb_flags =
           (pcVar3->timeout_event).ev_evcallback.evcb_flags | 0x10;
      event_priority_set(&pcVar3->timeout_event,0);
      pcVar3->base = base;
      iVar1 = base->n_common_timeouts;
      base->n_common_timeouts = iVar1 + 1;
      base->common_timeout_queues[iVar1] = pcVar3;
      new_ctl = (common_timeout_list *)&pcVar3->duration;
    }
  }
LAB_00388eaf:
  if ((new_ctl != (common_timeout_list *)0x0) &&
     (iVar1 = is_common_timeout((timeval *)new_ctl,base), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0x618,"is_common_timeout(result, base)","event_base_init_common_timeout");
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return (timeval *)new_ctl;
}

Assistant:

const struct timeval *
event_base_init_common_timeout(struct event_base *base,
    const struct timeval *duration)
{
	int i;
	struct timeval tv;
	const struct timeval *result=NULL;
	struct common_timeout_list *new_ctl;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (duration->tv_usec > 1000000) {
		memcpy(&tv, duration, sizeof(struct timeval));
		if (is_common_timeout(duration, base))
			tv.tv_usec &= MICROSECONDS_MASK;
		tv.tv_sec += tv.tv_usec / 1000000;
		tv.tv_usec %= 1000000;
		duration = &tv;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		const struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		if (duration->tv_sec == ctl->duration.tv_sec &&
		    duration->tv_usec ==
		    (ctl->duration.tv_usec & MICROSECONDS_MASK)) {
			EVUTIL_ASSERT(is_common_timeout(&ctl->duration, base));
			result = &ctl->duration;
			goto done;
		}
	}
	if (base->n_common_timeouts == MAX_COMMON_TIMEOUTS) {
		event_warnx("%s: Too many common timeouts already in use; "
		    "we only support %d per event_base", __func__,
		    MAX_COMMON_TIMEOUTS);
		goto done;
	}
	if (base->n_common_timeouts_allocated == base->n_common_timeouts) {
		int n = base->n_common_timeouts < 16 ? 16 :
		    base->n_common_timeouts*2;
		struct common_timeout_list **newqueues =
		    mm_realloc(base->common_timeout_queues,
			n*sizeof(struct common_timeout_queue *));
		if (!newqueues) {
			event_warn("%s: realloc",__func__);
			goto done;
		}
		base->n_common_timeouts_allocated = n;
		base->common_timeout_queues = newqueues;
	}
	new_ctl = mm_calloc(1, sizeof(struct common_timeout_list));
	if (!new_ctl) {
		event_warn("%s: calloc",__func__);
		goto done;
	}
	TAILQ_INIT(&new_ctl->events);
	new_ctl->duration.tv_sec = duration->tv_sec;
	new_ctl->duration.tv_usec =
	    duration->tv_usec | COMMON_TIMEOUT_MAGIC |
	    (base->n_common_timeouts << COMMON_TIMEOUT_IDX_SHIFT);
	evtimer_assign(&new_ctl->timeout_event, base,
	    common_timeout_callback, new_ctl);
	new_ctl->timeout_event.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&new_ctl->timeout_event, 0);
	new_ctl->base = base;
	base->common_timeout_queues[base->n_common_timeouts++] = new_ctl;
	result = &new_ctl->duration;

done:
	if (result)
		EVUTIL_ASSERT(is_common_timeout(result, base));

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return result;
}